

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a)

{
  size_t sVar1;
  pointer pcVar2;
  size_t __n;
  ulong uVar3;
  pointer __dest;
  
  sVar1 = (a->piece_)._M_len;
  if (sVar1 == 0) {
    uVar3 = dest->_M_string_length;
  }
  else {
    uVar3 = dest->_M_string_length;
    if ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= uVar3) {
      __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                    ,0xbb,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
    }
  }
  std::__cxx11::string::_M_replace_aux((ulong)dest,uVar3,0,(char)sVar1);
  pcVar2 = (dest->_M_dataplus)._M_p;
  __dest = pcVar2 + uVar3;
  __n = (a->piece_)._M_len;
  if (__n != 0) {
    memcpy(__dest,(a->piece_)._M_str,__n);
  }
  if (__dest + __n == pcVar2 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xc1,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a) {
  ASSERT_NO_OVERLAP(*dest, a);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  assert(out == begin + dest->size());
}